

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int imcomp_compress_image(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int *piVar11;
  fitsfile *fptr;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  double *nullflagval;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  FITSfile *tileny;
  size_t __size;
  char *err_message;
  int iVar20;
  int local_278;
  int anynul;
  double *local_270;
  int local_264;
  int *local_260;
  fitsfile *local_258;
  long local_250;
  ulong local_248;
  float fltnull;
  long naxes [6];
  long incre [6];
  long lpixel [6];
  long fpixel [6];
  double dblnull;
  double dummy;
  long local_e8 [5];
  long local_c0;
  long tilesize [6];
  char card [81];
  
  dummy = 0.0;
  dblnull = -9.1191291391491e-36;
  fltnull = -9.11912e-36;
  incre[0] = 1;
  incre[1] = 1;
  incre[2] = 1;
  incre[3] = 1;
  incre[4] = 1;
  incre[5] = 1;
  if (0 < *status) {
    return *status;
  }
  tileny = outfptr->Fptr;
  __size = tileny->maxtilelen;
  iVar18 = tileny->zbitpix;
  local_260 = status;
  if (iVar18 == -0x20) {
    if (tileny->compress_type == 0x29) {
      iVar20 = 3;
    }
    else {
      iVar20 = 2;
    }
    local_278 = 0x2a;
    bVar10 = false;
LAB_0018c3b4:
    bVar7 = false;
LAB_0018c3bc:
    __size = __size << iVar20;
    bVar8 = false;
  }
  else {
    if (iVar18 < 0x10) {
      if (iVar18 != -0x40) {
        if (iVar18 != 8) {
LAB_0018cad4:
          ffpmsg("Bad image datatype. (imcomp_compress_image)");
          *status = 0x71;
          return 0x71;
        }
        local_278 = 0xb;
        bVar9 = true;
        if ((0x33 < (ulong)(uint)tileny->compress_type) ||
           ((0x8000000600800U >> ((ulong)(uint)tileny->compress_type & 0x3f) & 1) == 0)) {
          __size = __size << 2;
        }
        bVar10 = false;
        bVar7 = false;
        bVar8 = false;
        goto LAB_0018c3cc;
      }
      iVar20 = 3;
      local_278 = 0x52;
      bVar10 = true;
      goto LAB_0018c3b4;
    }
    if (iVar18 != 0x10) {
      if (iVar18 != 0x20) goto LAB_0018cad4;
      if (tileny->compress_type == 0x29) {
        iVar20 = 3;
      }
      else {
        iVar20 = 2;
      }
      local_278 = 0x1f;
      bVar7 = true;
      bVar10 = false;
      goto LAB_0018c3bc;
    }
    uVar12 = tileny->compress_type + 1;
    if ((uVar12 < 0x35) && ((0x10000000c01001U >> ((ulong)uVar12 & 0x3f) & 1) != 0)) {
      __size = __size * 2;
    }
    else {
      __size = __size << 2;
    }
    local_278 = 0x15;
    bVar8 = true;
    bVar10 = false;
    bVar7 = false;
  }
  bVar9 = false;
LAB_0018c3cc:
  local_270 = (double *)malloc(__size);
  piVar11 = local_260;
  if (local_270 == (double *)0x0) {
    ffpmsg("Out of memory. (imcomp_compress_image)");
    *local_260 = 0x71;
    return 0x71;
  }
  uVar12 = tileny->zndim;
  lVar13 = 0;
  do {
    if (lVar13 < (int)uVar12) {
      naxes[lVar13] = tileny->znaxis[lVar13];
      lVar19 = tileny->tilesize[lVar13];
    }
    else {
      naxes[lVar13] = 1;
      lVar19 = 1;
    }
    tilesize[lVar13] = lVar19;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 6);
  local_264 = iVar18;
  if (naxes[5] < 1) {
    free(local_270);
  }
  else {
    local_248 = 0;
    local_250 = 1;
    lVar13 = 1;
    lVar19 = local_e8[0];
    local_258 = outfptr;
    do {
      fpixel[5] = lVar13;
      lVar1 = tilesize[5] + lVar13;
      lpixel[5] = tilesize[5] + -1 + lVar13;
      if (naxes[5] < lVar1) {
        lpixel[5] = naxes[5];
      }
      local_c0 = (lpixel[5] - lVar13) + 1;
      if (0 < naxes[4]) {
        lVar13 = 1;
        do {
          fpixel[4] = lVar13;
          lVar2 = tilesize[4] + lVar13;
          lpixel[4] = tilesize[4] + -1 + lVar13;
          if (naxes[4] < lVar2) {
            lpixel[4] = naxes[4];
          }
          local_e8[4] = (lpixel[4] - lVar13) + 1;
          if (0 < naxes[3]) {
            lVar13 = 1;
            do {
              fpixel[3] = lVar13;
              lVar3 = tilesize[3] + lVar13;
              lpixel[3] = tilesize[3] + -1 + lVar13;
              if (naxes[3] < lVar3) {
                lpixel[3] = naxes[3];
              }
              local_e8[3] = (lpixel[3] - lVar13) + 1;
              if (0 < naxes[2]) {
                lVar13 = 1;
                do {
                  fpixel[2] = lVar13;
                  lVar4 = tilesize[2] + lVar13;
                  lpixel[2] = tilesize[2] + -1 + lVar13;
                  if (naxes[2] < lVar4) {
                    lpixel[2] = naxes[2];
                  }
                  local_e8[2] = (lpixel[2] - lVar13) + 1;
                  if (0 < naxes[1]) {
                    lVar13 = 1;
                    do {
                      fpixel[1] = lVar13;
                      lVar5 = tilesize[1] + lVar13;
                      lpixel[1] = tilesize[1] + -1 + lVar13;
                      if (naxes[1] < lVar5) {
                        lpixel[1] = naxes[1];
                      }
                      local_e8[1] = (lpixel[1] - lVar13) + 1;
                      if (0 < naxes[0]) {
                        lVar13 = 1;
                        do {
                          lVar6 = tilesize[0] + lVar13;
                          lpixel[0] = tilesize[0] + -1 + lVar13;
                          if (naxes[0] < lVar6) {
                            lpixel[0] = naxes[0];
                          }
                          lVar19 = (lpixel[0] - lVar13) + 1;
                          fpixel[0] = lVar13;
                          lVar13 = lVar19;
                          if (1 < (int)uVar12) {
                            lVar14 = 1;
                            do {
                              lVar13 = lVar13 * local_e8[lVar14];
                              lVar14 = lVar14 + 1;
                            } while ((int)uVar12 != lVar14);
                          }
                          anynul = 0;
                          if (local_264 == -0x20) {
                            ffgsve(infptr,1,uVar12,naxes,fpixel,lpixel,incre,-9.11912e-36,
                                   (float *)local_270,&anynul,piVar11);
                          }
                          else if (bVar10) {
                            ffgsvd(infptr,1,uVar12,naxes,fpixel,lpixel,incre,-9.1191291391491e-36,
                                   local_270,&anynul,piVar11);
                          }
                          else if (bVar7) {
                            ffgsvk(infptr,1,uVar12,naxes,fpixel,lpixel,incre,0,(int *)local_270,
                                   &anynul,piVar11);
                          }
                          else if (bVar8) {
                            ffgsvi(infptr,1,uVar12,naxes,fpixel,lpixel,incre,0,(short *)local_270,
                                   &anynul,piVar11);
                          }
                          else {
                            if (!bVar9) {
                              err_message = "Error bad datatype of image tile to compress";
                              goto LAB_0018ca83;
                            }
                            ffgsvb(infptr,1,uVar12,naxes,fpixel,lpixel,incre,'\0',(uchar *)local_270
                                   ,&anynul,piVar11);
                          }
                          if (*piVar11 == 0) {
                            tileny = (FITSfile *)0x1;
                            lVar14 = 0;
                            if (0 < (int)uVar12) {
                              uVar15 = 0;
                              do {
                                lVar16 = lpixel[uVar15] - fpixel[uVar15];
                                if (lVar16 != 0 && fpixel[uVar15] <= lpixel[uVar15]) {
                                  lVar16 = lVar16 + 1;
                                  lVar17 = lVar16;
                                  if (lVar14 == 0) {
                                    lVar17 = 1;
                                    lVar14 = lVar16;
                                  }
                                  tileny = (FITSfile *)((long)tileny * lVar17);
                                }
                                uVar15 = uVar15 + 1;
                              } while (uVar12 != uVar15);
                            }
                            outfptr = (fitsfile *)(lVar14 + (ulong)(lVar14 == 0));
                          }
                          if (anynul == 0 || local_264 != -0x20) {
                            if (bVar10 && anynul != 0) {
                              iVar18 = 0x52;
                              nullflagval = &dblnull;
                              goto LAB_0018c8fe;
                            }
                            nullflagval = &dummy;
                            iVar20 = 0;
                            iVar18 = local_278;
                          }
                          else {
                            iVar18 = 0x2a;
                            nullflagval = (double *)&fltnull;
LAB_0018c8fe:
                            iVar20 = 1;
                          }
                          imcomp_compress_tile
                                    (local_258,local_250,iVar18,local_270,lVar13,(long)outfptr,
                                     (long)tileny,iVar20,nullflagval,piVar11);
                          if (0 < *piVar11) {
                            err_message = "Error writing compressed image to table";
LAB_0018ca83:
                            local_e8[0] = lVar19;
                            ffpmsg(err_message);
                            free(local_270);
                            return *piVar11;
                          }
                          local_248 = local_248 & 0xffffffff;
                          if (anynul != 0) {
                            local_248 = 1;
                          }
                          local_250 = local_250 + 1;
                          lVar13 = lVar6;
                        } while (lVar6 <= naxes[0]);
                      }
                      lVar13 = lVar5;
                    } while (lVar5 <= naxes[1]);
                  }
                  lVar13 = lVar4;
                } while (lVar4 <= naxes[2]);
              }
              lVar13 = lVar3;
            } while (lVar3 <= naxes[3]);
          }
          lVar13 = lVar2;
        } while (lVar2 <= naxes[4]);
      }
      lVar13 = lVar1;
    } while (lVar1 <= naxes[5]);
    local_e8[0] = lVar19;
    free(local_270);
    fptr = local_258;
    piVar11 = local_260;
    if ((int)local_248 != 0) {
      ffgcrd(local_258,"ZCMPTYPE",card,local_260);
      ffikyj(fptr,"ZBLANK",-0x7fffffff,"null value in the compressed integer array",piVar11);
    }
  }
  return *local_260;
}

Assistant:

int imcomp_compress_image (fitsfile *infptr, fitsfile *outfptr, int *status)

/* This routine does the following:
        - reads an image one tile at a time
        - if it is a float or double image, then it tries to quantize the pixels
          into scaled integers.
        - it then compressess the integer pixels, or if the it was not
	  possible to quantize the floating point pixels, then it losslessly
	  compresses them with gzip
	- writes the compressed byte stream to the output FITS file
*/
{
    double *tiledata;
    int anynul, gotnulls = 0, datatype;
    long ii, row;
    int naxis;
    double dummy = 0., dblnull = DOUBLENULLVALUE;
    float fltnull = FLOATNULLVALUE;
    long maxtilelen, tilelen, incre[] = {1, 1, 1, 1, 1, 1};
    long naxes[MAX_COMPRESS_DIM], fpixel[MAX_COMPRESS_DIM];
    long lpixel[MAX_COMPRESS_DIM], tile[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM];
    long i0, i1, i2, i3, i4, i5, trowsize, ntrows;
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    maxtilelen = (outfptr->Fptr)->maxtilelen;

    /* 
     Allocate buffer to hold 1 tile of data; size depends on which compression 
     algorithm is used:

      Rice and GZIP will compress byte, short, or int arrays without conversion.
      PLIO requires 4-byte int values, so byte and short arrays must be converted to int.
      HCompress internally converts byte or short values to ints, and
         converts int values to 8-byte longlong integers.
    */
    
    if ((outfptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        datatype = TFLOAT;

        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */
            tiledata = (double*) malloc (maxtilelen * 2 *sizeof (float));	
	} else {
            tiledata = (double*) malloc (maxtilelen * sizeof (float));
	}
    }
    else if ((outfptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        datatype = TDOUBLE;
        tiledata = (double*) malloc (maxtilelen * sizeof (double));
    }
    else if ((outfptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
             (outfptr->Fptr)->compress_type == NOCOMPRESS) {
	    /* only need  buffer of I*2 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen * sizeof (short));	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == BYTE_IMG)
    {

        datatype = TBYTE;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2) {
	    /* only need  buffer of I*1 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen);	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */

            tiledata = (double*) malloc (maxtilelen * 2 * sizeof (int));	
	} else {
 	    /* only need  buffer of I*4 pixels for gzip, bzip2,  Rice, and PLIO */

            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else
    {
	ffpmsg("Bad image datatype. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }
    
    if (tiledata == NULL)
    {
	ffpmsg("Out of memory. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }

    /*  calculate size of tile in each dimension */
    naxis = (outfptr->Fptr)->zndim;
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        if (ii < naxis)
        {
             naxes[ii] = (outfptr->Fptr)->znaxis[ii];
             tilesize[ii] = (outfptr->Fptr)->tilesize[ii];
        }
        else
        {
            naxes[ii] = 1;
            tilesize[ii] = 1;
        }
    }
    row = 1;

    /* set up big loop over up to 6 dimensions */
    for (i5 = 1; i5 <= naxes[5]; i5 += tilesize[5])
    {
     fpixel[5] = i5;
     lpixel[5] = minvalue(i5 + tilesize[5] - 1, naxes[5]);
     tile[5] = lpixel[5] - fpixel[5] + 1;
     for (i4 = 1; i4 <= naxes[4]; i4 += tilesize[4])
     {
      fpixel[4] = i4;
      lpixel[4] = minvalue(i4 + tilesize[4] - 1, naxes[4]);
      tile[4] = lpixel[4] - fpixel[4] + 1;
      for (i3 = 1; i3 <= naxes[3]; i3 += tilesize[3])
      {
       fpixel[3] = i3;
       lpixel[3] = minvalue(i3 + tilesize[3] - 1, naxes[3]);
       tile[3] = lpixel[3] - fpixel[3] + 1;
       for (i2 = 1; i2 <= naxes[2]; i2 += tilesize[2])
       {
        fpixel[2] = i2;
        lpixel[2] = minvalue(i2 + tilesize[2] - 1, naxes[2]);
        tile[2] = lpixel[2] - fpixel[2] + 1;
        for (i1 = 1; i1 <= naxes[1]; i1 += tilesize[1])
        {
         fpixel[1] = i1;
         lpixel[1] = minvalue(i1 + tilesize[1] - 1, naxes[1]);
         tile[1] = lpixel[1] - fpixel[1] + 1;
         for (i0 = 1; i0 <= naxes[0]; i0 += tilesize[0])
         {
          fpixel[0] = i0;
          lpixel[0] = minvalue(i0 + tilesize[0] - 1, naxes[0]);
          tile[0] = lpixel[0] - fpixel[0] + 1;

          /* number of pixels in this tile */
          tilelen = tile[0];
          for (ii = 1; ii < naxis; ii++)
          {
             tilelen *= tile[ii];
          }

          /* read next tile of data from image */
	  anynul = 0;
          if (datatype == TFLOAT)
          {
              ffgsve(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  FLOATNULLVALUE, (float *) tiledata,  &anynul, status);
          }
          else if (datatype == TDOUBLE)
          {
              ffgsvd(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  DOUBLENULLVALUE, tiledata, &anynul, status);
          }
          else if (datatype == TINT)
          {
              ffgsvk(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (int *) tiledata,  &anynul, status);
          }
          else if (datatype == TSHORT)
          {
              ffgsvi(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (short *) tiledata,  &anynul, status);
          }
          else if (datatype == TBYTE)
          {
              ffgsvb(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (unsigned char *) tiledata,  &anynul, status);
          }
          else 
          {
              ffpmsg("Error bad datatype of image tile to compress");
              free(tiledata);
              return (*status);
          }

          /* now compress the tile, and write to row of binary table */
          /*   NOTE: we don't have to worry about the presence of null values in the
	       array if it is an integer array:  the null value is simply encoded
	       in the compressed array just like any other pixel value.  
	       
	       If it is a floating point array, then we need to check for null
	       only if the anynul parameter returned a true value when reading the tile
	  */
          
          /* Collapse sizes of higher dimension tiles into 2 dimensional
             equivalents needed by the quantizing algorithms for
             floating point types */
          fits_calc_tile_rows(lpixel, fpixel, naxis, &trowsize,
                            &ntrows, status);

          if (anynul && datatype == TFLOAT) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &fltnull, status);
          } else if (anynul && datatype == TDOUBLE) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &dblnull, status);
          } else {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 0, &dummy, status);
          }

          /* set flag if we found any null values */
          if (anynul)
              gotnulls = 1;

          /* check for any error in the previous operations */
          if (*status > 0)
          {
              ffpmsg("Error writing compressed image to table");
              free(tiledata);
              return (*status);
          }

	  row++;
         }
        }
       }
      }
     }
    }

    free (tiledata);  /* finished with this buffer */

    /* insert ZBLANK keyword if necessary; only for TFLOAT or TDOUBLE images */
    if (gotnulls)
    {
          ffgcrd(outfptr, "ZCMPTYPE", card, status);
          ffikyj(outfptr, "ZBLANK", COMPRESS_NULL_VALUE, 
             "null value in the compressed integer array", status);
    }

    return (*status);
}